

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

void rw::ps2::objUninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *this;
  InstanceDataHeader *pIVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint32 uVar5;
  uint32 *__s;
  Mesh *pMVar6;
  uint8 *puVar7;
  int8 *adc;
  Pipeline *local_108;
  MatPipeline *local_100;
  MatPipeline *local_f8;
  int8 *bits;
  MatPipeline *m_2;
  Mesh *mesh_2;
  uint32 i_2;
  uint8 *raw;
  uint8 *data [10];
  MatPipeline *local_70;
  MatPipeline *m_1;
  InstanceData *instance;
  Mesh *mesh_1;
  MatPipeline *pMStack_50;
  uint32 i_1;
  MatPipeline *m;
  Mesh *mesh;
  uint32 i;
  uint32 *flags;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    pIVar1 = this->instData;
    this->numVertices = this->meshHeader->totalIndices;
    uVar5 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar5;
    Geometry::allocateData(this);
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    __s = (uint32 *)
          mustmalloc_LOC((long)this->numVertices << 2,0x1000f,
                         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 879"
                        );
    memset(__s,0,(long)(this->numVertices << 2));
    pMVar6 = MeshHeader::getMeshes(this->meshHeader);
    memset(pMVar6->indices,0,(ulong)(this->meshHeader->totalIndices << 1));
    for (mesh._4_4_ = 0; mesh._4_4_ < pIVar1[1].platform; mesh._4_4_ = mesh._4_4_ + 1) {
      pMVar6 = MeshHeader::getMeshes(this->meshHeader);
      lVar2._0_4_ = rwpipe[1].super_Pipeline.pluginID;
      lVar2._4_4_ = rwpipe[1].super_Pipeline.pluginData;
      if (lVar2 == 0) {
        local_f8 = (MatPipeline *)(pMVar6[mesh._4_4_].material)->pipeline;
      }
      else {
        local_f8 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
      }
      pMStack_50 = local_f8;
      if (local_f8 == (MatPipeline *)0x0) {
        pMStack_50 = defaultMatPipe;
      }
      if (pMStack_50->preUninstCB != (_func_void_MatPipeline_ptr_Geometry_ptr *)0x0) {
        (*pMStack_50->preUninstCB)(pMStack_50,this);
      }
    }
    this->numVertices = 0;
    for (mesh_1._4_4_ = 0; mesh_1._4_4_ < pIVar1[1].platform; mesh_1._4_4_ = mesh_1._4_4_ + 1) {
      pMVar6 = MeshHeader::getMeshes(this->meshHeader);
      pMVar6 = pMVar6 + mesh_1._4_4_;
      lVar2 = *(long *)(pIVar1 + 2);
      lVar3._0_4_ = rwpipe[1].super_Pipeline.pluginID;
      lVar3._4_4_ = rwpipe[1].super_Pipeline.pluginData;
      if (lVar3 == 0) {
        local_100 = (MatPipeline *)pMVar6->material->pipeline;
      }
      else {
        local_100 = *(MatPipeline **)&rwpipe[1].super_Pipeline;
      }
      local_70 = local_100;
      if (local_100 == (MatPipeline *)0x0) {
        local_70 = defaultMatPipe;
      }
      memset(&raw,0,0x50);
      puVar7 = MatPipeline::collectData
                         (local_70,this,(InstanceData *)(lVar2 + (ulong)mesh_1._4_4_ * 0x20),pMVar6,
                          &raw);
      (*local_70->uninstanceCB)(local_70,this,__s,pMVar6,&raw);
      (*DAT_00168638)(puVar7);
    }
    for (mesh_2._4_4_ = 0; mesh_2._4_4_ < pIVar1[1].platform; mesh_2._4_4_ = mesh_2._4_4_ + 1) {
      pMVar6 = MeshHeader::getMeshes(this->meshHeader);
      lVar4._0_4_ = rwpipe[1].super_Pipeline.pluginID;
      lVar4._4_4_ = rwpipe[1].super_Pipeline.pluginData;
      if (lVar4 == 0) {
        local_108 = (pMVar6[mesh_2._4_4_].material)->pipeline;
      }
      else {
        local_108 = *(Pipeline **)&rwpipe[1].super_Pipeline;
      }
      bits = (int8 *)local_108;
      if (local_108 == (Pipeline *)0x0) {
        bits = (int8 *)defaultMatPipe;
      }
      if (*(long *)(bits + 0x88) != 0) {
        (**(code **)(bits + 0x88))(bits,this);
      }
    }
    adc = getADCbits(this);
    Geometry::generateTriangles(this,adc);
    (*DAT_00168638)(__s);
    this->flags = this->flags & 0xfeffffff;
    destroyNativeData(this,0,0);
  }
  return;
}

Assistant:

static void
objUninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_PS2);
	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	// highest possible number of vertices
	geo->numVertices = geo->meshHeader->totalIndices;
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);
	uint32 *flags = rwNewT(uint32, geo->numVertices,
		MEMDUR_FUNCTION | ID_GEOMETRY);
	memset(flags, 0, 4*geo->numVertices);
	memset(geo->meshHeader->getMeshes()->indices, 0, 2*geo->meshHeader->totalIndices);
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;
		if(m->preUninstCB) m->preUninstCB(m, geo);
	}
	geo->numVertices = 0;
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		InstanceData *instance = &header->instanceMeshes[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;

		//printDMAVIF(instance);
		uint8 *data[nelem(m->attribs)] = { nil };
		uint8 *raw = m->collectData(geo, instance, mesh, data);
		assert(m->uninstanceCB);
		m->uninstanceCB(m, geo, flags, mesh, data);
		rwFree(raw);
	}
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->getMeshes()[i];
		MatPipeline *m;
		m = pipe->groupPipeline ?
		    pipe->groupPipeline :
		    (MatPipeline*)mesh->material->pipeline;
		if(m == nil) m = defaultMatPipe;
		if(m->postUninstCB) m->postUninstCB(m, geo);
	}

	int8 *bits = getADCbits(geo);
	geo->generateTriangles(bits);
	rwFree(flags);
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
/*
	for(uint32 i = 0; i < header->numMeshes; i++){
		Mesh *mesh = &geo->meshHeader->mesh[i];
		InstanceData *instance = &header->instanceMeshes[i];
//		printf("numIndices: %d\n", mesh->numIndices);
//		printDMA(instance);
		printVertCounts(instance, geo->meshHeader->flags);
	}
*/
}